

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

ZoneState * QLocalTime::utcToLocal(ZoneState *__return_storage_ptr__,qint64 utcMillis)

{
  bool bVar1;
  longlong *plVar2;
  int iVar3;
  long lVar4;
  DaylightStatus DVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  R_conflict3 RVar9;
  optional<long_long> oVar10;
  tm local;
  _Storage<long_long,_true> local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RVar9 = QRoundingDown::qDivMod<1000U,_long_long,_true>(utcMillis);
  lVar7 = (long)(int)RVar9.remainder;
  if (RVar9.quotient * 1000 + lVar7 == utcMillis) {
    local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
    local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
    local._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = qLocalTime(RVar9.quotient,&local);
    if (bVar1) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      oVar10 = QGregorianCalendar::julianFromParts
                         ((local.tm_year - (uint)(local.tm_year < -0x76b)) + 0x76c,local.tm_mon + 1,
                          local.tm_mday);
      local_48._M_value =
           oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      local_40 = (undefined1 *)
                 CONCAT71(local_40._1_7_,
                          oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
      DVar5 = UnknownDaylightTime;
      if (((undefined1  [16])
           oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
         ) {
LAB_00122ebc:
        iVar3 = 0;
        bVar1 = false;
      }
      else {
        lVar8 = (long)local.tm_sec + ((long)local.tm_min + (long)local.tm_hour * 0x3c) * 0x3c;
        plVar2 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
                 _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                         *)&local_48);
        lVar4 = *plVar2 + -0x253d8c;
        lVar6 = lVar4 * 0x15180 + lVar8;
        if ((SEXT816(lVar4 * 0x15180) != SEXT816(lVar4) * SEXT416(0x15180)) ||
           (SCARRY8(lVar4 * 0x15180,lVar8))) goto LAB_00122ebc;
        iVar3 = 0;
        if (SEXT816(lVar6 * 1000) != SEXT816(lVar6) * SEXT416(1000)) goto LAB_00122ebc;
        bVar1 = false;
        if (!SCARRY8(lVar6 * 1000,lVar7)) {
          DVar5 = (DaylightStatus)(local.tm_isdst != 0);
          iVar3 = (int)lVar6 - (int)RVar9.quotient;
          bVar1 = true;
          utcMillis = lVar6 * 1000 + lVar7;
        }
      }
      __return_storage_ptr__->when = utcMillis;
      __return_storage_ptr__->offset = iVar3;
      __return_storage_ptr__->dst = DVar5;
      __return_storage_ptr__->valid = bVar1;
      goto LAB_00122e98;
    }
  }
  __return_storage_ptr__->when = utcMillis;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->dst = UnknownDaylightTime;
  __return_storage_ptr__->valid = false;
LAB_00122e98:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState utcToLocal(qint64 utcMillis)
{
    const auto epoch = QRoundingDown::qDivMod<MSECS_PER_SEC>(utcMillis);
    const time_t epochSeconds = epoch.quotient;
    const int msec = epoch.remainder;
    Q_ASSERT(msec >= 0 && msec < MSECS_PER_SEC);
    if (qint64(epochSeconds) * MSECS_PER_SEC + msec != utcMillis) // time_t range too narrow
        return {utcMillis};

    tm local;
    if (!qLocalTime(epochSeconds, &local))
        return {utcMillis};

    auto jd = tmToJd(local);
    if (Q_UNLIKELY(!jd))
        return {utcMillis};

    const qint64 daySeconds = tmSecsWithinDay(local);
    Q_ASSERT(0 <= daySeconds && daySeconds < SECS_PER_DAY);
    qint64 localSeconds, localMillis;
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySeconds, &localSeconds)
                   || secondsAndMillisOverflow(localSeconds, qint64(msec), &localMillis))) {
        return {utcMillis};
    }
    const auto dst
        = local.tm_isdst ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;
    return { localMillis, int(localSeconds - epochSeconds), dst };
}